

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

ProjectionLight *
pbrt::ProjectionLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  undefined1 uVar1;
  ulong uVar2;
  ProjectionLight *pPVar3;
  Image *in_RDX;
  string *this;
  undefined8 in_R8;
  Float FVar4;
  Float x;
  Float FVar5;
  Transform renderFromLightFlipY;
  Transform flip;
  Image image;
  ColorEncodingHandle *in_stack_00000338;
  string *in_stack_00000340;
  Allocator in_stack_00000348;
  ImageChannelDesc channelDesc;
  RGBColorSpace *colorSpace;
  ImageAndMetadata imageAndMetadata;
  string texname;
  Float fov;
  Float power;
  Float scale;
  ImageMetadata *in_stack_fffffffffffff898;
  ParameterDictionary *in_stack_fffffffffffff8a0;
  ImageAndMetadata *this_00;
  iterator in_stack_fffffffffffff8a8;
  size_type in_stack_fffffffffffff8b0;
  float *in_stack_fffffffffffff8c0;
  RGBColorSpace **in_stack_fffffffffffff8c8;
  Image *in_stack_fffffffffffff8d0;
  MediumHandle *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  string *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  string *psVar6;
  ParameterDictionary *in_stack_fffffffffffff8f8;
  float *args_5;
  allocator<char> *args_6;
  polymorphic_allocator<std::byte> *args_7;
  Transform *t2;
  Transform *this_01;
  string *in_stack_fffffffffffff938;
  allocator<char> *paVar7;
  Float in_stack_fffffffffffff970;
  allocator<char> *paVar8;
  undefined4 in_stack_fffffffffffff988;
  Image *this_02;
  Allocator in_stack_fffffffffffff9a8;
  allocator<char> local_433;
  allocator<char> local_432;
  undefined1 local_431 [9];
  undefined1 local_428 [64];
  float local_3e8 [8];
  undefined1 *local_3c8;
  Float local_3c0 [18];
  RGBColorSpace *local_378;
  undefined8 local_368;
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  Float local_90;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [23];
  undefined1 local_51 [81];
  
  this_02 = (Image *)local_51;
  local_51._49_8_ = in_RDX;
  local_51._73_8_ = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  FVar4 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff8a0,(string *)in_stack_fffffffffffff898,0.0);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  paVar8 = &local_89;
  local_51._37_4_ = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  x = ParameterDictionary::GetOneFloat
                (in_stack_fffffffffffff8a0,(string *)in_stack_fffffffffffff898,0.0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  paVar7 = &local_b1;
  local_68._0_4_ = x;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  FVar5 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffff8a0,(string *)in_stack_fffffffffffff898,0.0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  ResolveFilename(in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898);
  }
  local_368 = local_51._73_8_;
  ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  Image::Read(in_stack_00000340,in_stack_00000348,in_stack_00000338);
  local_378 = ImageMetadata::GetColorSpace(in_stack_fffffffffffff898);
  t2 = (Transform *)local_428;
  this_01 = (Transform *)local_431;
  local_431._1_8_ = t2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  args_7 = (polymorphic_allocator<std::byte> *)(local_428 + 0x20);
  local_431._1_8_ = args_7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  args_5 = local_3e8;
  args_6 = &local_433;
  local_431._1_8_ = args_5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (char *)in_stack_fffffffffffff8d8,(allocator<char> *)in_stack_fffffffffffff8d0);
  local_3c8 = local_428;
  local_3c0._0_8_ = 3;
  v._M_len = in_stack_fffffffffffff8b0;
  v._M_array = in_stack_fffffffffffff8a8;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff8a0,v);
  requestedChannels.n._0_4_ = in_stack_fffffffffffff988;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar8;
  requestedChannels.n._4_4_ = FVar4;
  Image::GetChannelDesc((Image *)local_51._49_8_,requestedChannels);
  psVar6 = (string *)local_428;
  this = (string *)&local_3c8;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
    FVar4 = (Float)((ulong)paVar7 >> 0x20);
  } while (this != psVar6);
  std::allocator<char>::~allocator(&local_433);
  std::allocator<char>::~allocator(&local_432);
  std::allocator<char>::~allocator((allocator<char> *)local_431);
  uVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6edb60);
  if (!(bool)uVar1) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898);
  }
  Image::SelectChannels(this_02,(ImageChannelDesc *)in_RDX,in_stack_fffffffffffff9a8);
  Scale(x,in_stack_fffffffffffff970,FVar4);
  Transform::operator*(this_01,t2);
  this_00 = (ImageAndMetadata *)local_68;
  pPVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,
                      (Transform *)CONCAT17(uVar1,in_stack_fffffffffffff8e0),
                      in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                      in_stack_fffffffffffff8c0,args_5,(float *)args_6,args_7);
  Image::~Image(&this_00->image);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x6eddbf);
  ImageAndMetadata::~ImageAndMetadata(this_00);
  std::__cxx11::string::~string(local_d8);
  return pPVar3;
}

Assistant:

ProjectionLight *ProjectionLight::Create(const Transform &renderFromLight,
                                         MediumHandle medium,
                                         const ParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    Float scale = parameters.GetOneFloat("scale", 1);
    Float power = parameters.GetOneFloat("power", -1);
    Float fov = parameters.GetOneFloat("fov", 90.);

    std::string texname = ResolveFilename(parameters.GetOneString("filename", ""));
    if (texname.empty())
        ErrorExit(loc, "Must provide \"filename\" to \"projection\" light source");

    ImageAndMetadata imageAndMetadata = Image::Read(texname, alloc);
    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

    ImageChannelDesc channelDesc = imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit(loc, "Image provided to \"projection\" light must have R, G, "
                       "and B channels.");
    Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

    Transform flip = Scale(1, -1, 1);
    Transform renderFromLightFlipY = renderFromLight * flip;

    return alloc.new_object<ProjectionLight>(renderFromLightFlipY, medium,
                                             std::move(image), colorSpace, scale, fov,
                                             power, alloc);
}